

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iend,
                 size_t *offsetPtr,U32 mls,U32 extDict)

{
  BYTE *pBVar1;
  uint uVar2;
  uint uVar3;
  U32 UVar4;
  uint uVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  BYTE *pBVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  uint *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint *puVar20;
  int iVar21;
  uint uVar22;
  BYTE *pBVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  byte *pInLimit;
  uint uVar32;
  bool bVar33;
  uint *local_108;
  ulong local_100;
  U32 dummy32;
  uint local_64;
  ulong *local_60;
  BYTE *local_58;
  uint *local_50;
  ZSTD_compressionParameters *local_48;
  BYTE *local_40;
  byte *local_38;
  
  pUVar6 = ms->hashTable;
  local_60 = offsetPtr;
  sVar13 = ZSTD_hashPtr(ip,cParams->hashLog,mls);
  pBVar7 = (ms->window).base;
  uVar32 = (int)ip - (int)pBVar7;
  uVar2 = (ms->window).lowLimit;
  uVar27 = ~(-1 << ((char)cParams->chainLog - 1U & 0x1f));
  uVar19 = uVar32 - uVar27;
  if (uVar32 < uVar27) {
    uVar19 = 0;
  }
  uVar24 = uVar2;
  if (uVar2 < uVar19) {
    uVar24 = uVar19;
  }
  uVar25 = 1 << ((byte)cParams->searchLog & 0x1f);
  local_50 = pUVar6 + sVar13;
  pUVar6 = ms->chainTable;
  puVar14 = local_50;
  uVar28 = uVar25;
  uVar29 = 0;
  while (uVar3 = *puVar14, local_48 = cParams, uVar24 < uVar3) {
    puVar14 = pUVar6 + (uVar3 & uVar27) * 2;
    if ((puVar14[1] != 1) || (uVar28 < 2)) {
      if (puVar14[1] == 1) {
        puVar14[0] = 0;
        puVar14[1] = 0;
      }
      break;
    }
    puVar14[1] = uVar29;
    uVar28 = uVar28 - 1;
    uVar29 = uVar3;
  }
  do {
    if (uVar29 == 0) break;
    UVar4 = pUVar6[(ulong)((uVar29 & uVar27) * 2) + 1];
    uVar30 = ~(-1 << ((char)local_48->chainLog - 1U & 0x1f));
    local_58 = (ms->window).dictBase;
    uVar3 = (ms->window).dictLimit;
    uVar18 = (ulong)uVar3;
    local_38 = local_58 + uVar18;
    pInLimit = iend;
    pBVar8 = pBVar7;
    if (uVar29 < uVar3) {
      pInLimit = local_38;
      pBVar8 = local_58;
    }
    local_40 = pBVar7 + uVar18;
    uVar11 = (uVar29 & uVar30) * 2;
    local_108 = pUVar6 + uVar11;
    uVar22 = pUVar6[uVar11];
    uVar5 = (ms->window).lowLimit;
    uVar12 = 0;
    uVar26 = 0;
    uVar16 = 0;
    puVar14 = pUVar6 + uVar11 + 1;
LAB_00190360:
    if ((uVar28 == uVar12) || (uVar22 <= uVar5)) goto LAB_001904de;
    uVar15 = uVar26;
    if (uVar16 < uVar26) {
      uVar15 = uVar16;
    }
    uVar17 = (ulong)uVar22;
    pBVar23 = pBVar7;
    if (extDict == 0) {
LAB_00190418:
      sVar13 = ZSTD_count(pBVar8 + uVar15 + uVar29,pBVar23 + uVar17 + uVar15,pInLimit);
      uVar15 = sVar13 + uVar15;
      pBVar23 = pBVar23 + uVar17;
    }
    else {
      if ((uVar29 < uVar3) || (uVar18 <= uVar17 + uVar15)) {
        if (uVar17 + uVar15 < uVar18) {
          pBVar23 = local_58;
        }
        goto LAB_00190418;
      }
      pBVar1 = local_58 + uVar17;
      sVar13 = ZSTD_count_2segments
                         (pBVar8 + uVar15 + uVar29,pBVar1 + uVar15,pInLimit,local_38,local_40);
      uVar15 = sVar13 + uVar15;
      pBVar23 = pBVar7 + uVar17;
      if (uVar15 + uVar17 < uVar18) {
        pBVar23 = pBVar1;
      }
    }
    if (pBVar8 + uVar15 + uVar29 == pInLimit) goto LAB_001904de;
    puVar20 = pUVar6 + (uVar22 & uVar30) * 2;
    if (pBVar8[uVar15 + uVar29] <= pBVar23[uVar15]) {
      *puVar14 = uVar22;
      puVar14 = puVar20;
      uVar26 = uVar15;
      if (uVar22 <= uVar24) {
        puVar14 = &local_64;
        goto LAB_001904de;
      }
LAB_001904a5:
      uVar22 = *puVar14;
      uVar12 = uVar12 + 1;
      puVar14 = puVar20;
      goto LAB_00190360;
    }
    *local_108 = uVar22;
    if (uVar24 < uVar22) {
      local_108 = puVar20 + 1;
      puVar20 = puVar14;
      puVar14 = local_108;
      uVar16 = uVar15;
      goto LAB_001904a5;
    }
    local_108 = &local_64;
LAB_001904de:
    *puVar14 = 0;
    *local_108 = 0;
    uVar28 = uVar28 + 1;
    uVar29 = UVar4;
  } while( true );
  pBVar8 = (ms->window).dictBase;
  uVar15 = (ulong)(ms->window).dictLimit;
  uVar16 = (ulong)((uVar27 & uVar32) * 2);
  local_108 = pUVar6 + uVar16;
  iVar31 = uVar32 + 9;
  uVar24 = *local_50;
  *local_50 = uVar32;
  uVar26 = 0;
  uVar18 = 0;
  local_100 = 0;
  puVar14 = pUVar6 + uVar16 + 1;
  do {
    uVar16 = (ulong)uVar24;
    bVar33 = uVar25 == 0;
    uVar25 = uVar25 - 1;
    if ((bVar33) || (uVar24 <= uVar2)) goto LAB_00190716;
    uVar17 = uVar18;
    if (uVar26 < uVar18) {
      uVar17 = uVar26;
    }
    if ((extDict == 0) || (uVar15 <= uVar17 + uVar16)) {
      sVar13 = ZSTD_count(ip + uVar17,pBVar7 + uVar16 + uVar17,iend);
      uVar17 = sVar13 + uVar17;
      pBVar23 = pBVar7 + uVar16;
    }
    else {
      pBVar1 = pBVar8 + uVar16;
      sVar13 = ZSTD_count_2segments
                         (ip + uVar17,pBVar1 + uVar17,iend,pBVar8 + uVar15,pBVar7 + uVar15);
      uVar17 = sVar13 + uVar17;
      pBVar23 = pBVar7 + uVar16;
      if (uVar17 + uVar16 < uVar15) {
        pBVar23 = pBVar1;
      }
    }
    if (local_100 < uVar17) {
      iVar9 = uVar24 + (int)uVar17;
      if (uVar17 <= iVar31 - uVar24) {
        iVar9 = iVar31;
      }
      iVar31 = iVar9;
      iVar21 = (int)uVar17 - (int)local_100;
      uVar28 = (uVar32 + 1) - uVar24;
      iVar9 = 0x1f;
      if (uVar28 != 0) {
        for (; uVar28 >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      uVar28 = (int)*local_60 + 1;
      iVar10 = 0x1f;
      if (uVar28 != 0) {
        for (; uVar28 >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      if (iVar9 - iVar10 < iVar21 * 4) {
        *local_60 = (ulong)((uVar32 + 2) - uVar24);
        local_100 = uVar17;
      }
      if (ip + uVar17 == iend) goto LAB_00190716;
    }
    puVar20 = pUVar6 + (uVar24 & uVar27) * 2;
    if (pBVar23[uVar17] < ip[uVar17]) {
      *local_108 = uVar24;
      if (uVar24 <= uVar19) {
        local_108 = &dummy32;
LAB_00190716:
        *puVar14 = 0;
        *local_108 = 0;
        ms->nextToUpdate = iVar31 - 8;
        return local_100;
      }
      local_108 = puVar20 + 1;
      puVar20 = puVar14;
      puVar14 = local_108;
      uVar26 = uVar17;
    }
    else {
      *puVar14 = uVar24;
      uVar18 = uVar17;
      puVar14 = puVar20;
      if (uVar24 <= uVar19) {
        puVar14 = &dummy32;
        goto LAB_00190716;
      }
    }
    uVar24 = *puVar14;
    puVar14 = puVar20;
  } while( true );
}

Assistant:

static size_t ZSTD_DUBT_findBestMatch (
                            ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                            const BYTE* const ip, const BYTE* const iend,
                            size_t* offsetPtr,
                            U32 const mls,
                            U32 const extDict)
{
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ms->window.lowLimit;

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;   /* nullify next candidate if it's still unsorted (note : simplification, detrimental to compression ratio, beneficial for speed) */
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, cParams, matchIndex, iend,
                         nbCandidates, unsortLimit, extDict);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller=0, commonLengthLarger=0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current+8+1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((!extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}